

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

zip_t * zip_openwitherror(char *zipname,int level,char mode,int *errnum)

{
  mz_bool mVar1;
  zip_t *pZip;
  FILE *__stream;
  uint uVar2;
  
  *errnum = 0;
  if ((zipname == (char *)0x0) || (*zipname == '\0')) {
    *errnum = -0x16;
  }
  else {
    uVar2 = 6;
    if (-1 < level) {
      uVar2 = level;
    }
    if ((uVar2 & 0xf) < 0xb) {
      pZip = (zip_t *)calloc(1,0x4e078);
      if (pZip != (zip_t *)0x0) {
        pZip->level = uVar2;
        (pZip->entry).index = -1;
        if (mode < 'r') {
          if ((mode == 'a') || (mode == 'd')) {
            __stream = fopen(zipname,"r+b");
            if (__stream == (FILE *)0x0) {
              *errnum = -0x10;
            }
            else {
              mVar1 = mz_zip_reader_init_cfile
                                ((mz_zip_archive *)pZip,(FILE *)__stream,0,pZip->level | 0x800);
              if (mVar1 == 0) {
                *errnum = -0x1e;
                fclose(__stream);
              }
              else {
                mVar1 = mz_zip_writer_init_from_reader_v2((mz_zip_archive *)pZip,zipname,0);
                if (mVar1 != 0) {
                  (pZip->archive).m_zip_type = MZ_ZIP_TYPE_FILE;
                  return pZip;
                }
                *errnum = -0x20;
                fclose(__stream);
                mz_zip_reader_end_internal((mz_zip_archive *)pZip,1);
              }
            }
            goto LAB_0010e37a;
          }
        }
        else {
          if (mode == 'r') {
            mVar1 = mz_zip_reader_init_file_v2((mz_zip_archive *)pZip,zipname,uVar2 | 0x800,0,0);
            if (mVar1 != 0) {
              return pZip;
            }
            *errnum = -0x1e;
            goto LAB_0010e37a;
          }
          if (mode == 'w') {
            mVar1 = mz_zip_writer_init_file_v2((mz_zip_archive *)pZip,zipname,0,0x4000);
            if (mVar1 != 0) {
              return pZip;
            }
            *errnum = -0x1f;
            goto LAB_0010e37a;
          }
        }
        *errnum = -4;
        goto LAB_0010e37a;
      }
      *errnum = -0x15;
    }
    else {
      *errnum = -5;
    }
  }
  pZip = (zip_t *)0x0;
LAB_0010e37a:
  if (pZip != (zip_t *)0x0) {
    free(pZip);
  }
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_openwitherror(const char *zipname, int level, char mode,
                                int *errnum) {
  struct zip_t *zip = NULL;
  *errnum = 0;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    *errnum = ZIP_EINVZIPNAME;
    goto cleanup;
  }

  if (level < 0)
    level = MZ_DEFAULT_LEVEL;
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    *errnum = ZIP_EINVLVL;
    goto cleanup;
  }

  zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip) {
    // out of memory
    *errnum = ZIP_EOOMEM;
    goto cleanup;
  }

  zip->level = (mz_uint)level;
  zip->entry.index = -1;
  switch (mode) {
  case 'w':
    // Create a new archive.
    if (!mz_zip_writer_init_file_v2(&(zip->archive), zipname, 0,
                                    MZ_ZIP_FLAG_WRITE_ZIP64)) {
      // Cannot initialize zip_archive writer
      *errnum = ZIP_EWINIT;
      goto cleanup;
    }
    break;

  case 'r':
    if (!mz_zip_reader_init_file_v2(
            &(zip->archive), zipname,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY, 0, 0)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      *errnum = ZIP_ERINIT;
      goto cleanup;
    }
    break;

  case 'a':
  case 'd': {
    MZ_FILE *fp = MZ_FOPEN(zipname, "r+b");
    if (!fp) {
      *errnum = ZIP_EOPNFILE;
      goto cleanup;
    }
    if (!mz_zip_reader_init_cfile(
            &(zip->archive), fp, 0,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize zip_archive
      // reader
      *errnum = ZIP_ERINIT;
      fclose(fp);
      goto cleanup;
    }
    if (!mz_zip_writer_init_from_reader_v2(&(zip->archive), zipname, 0)) {
      *errnum = ZIP_EWRINIT;
      fclose(fp);
      mz_zip_reader_end(&(zip->archive));
      goto cleanup;
    }
    // The file pointer is now owned by the archive object.
    zip->archive.m_zip_type = MZ_ZIP_TYPE_FILE;
  } break;

  default:
    *errnum = ZIP_EINVMODE;
    goto cleanup;
  }

  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}